

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

void IsoWriter::writeEntity(FileEntryInfo *dir)

{
  pointer ppFVar1;
  FileEntryInfo **i;
  pointer ppFVar2;
  
  FileEntryInfo::serialize(dir);
  ppFVar1 = (dir->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar2 = (dir->m_files).
                 super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar2 != ppFVar1; ppFVar2 = ppFVar2 + 1) {
    writeEntity(*ppFVar2);
  }
  ppFVar1 = (dir->m_subDirs).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar2 = (dir->m_subDirs).
                 super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar2 != ppFVar1; ppFVar2 = ppFVar2 + 1) {
    writeEntity(*ppFVar2);
  }
  return;
}

Assistant:

void IsoWriter::writeEntity(const FileEntryInfo *dir)
{
    dir->serialize();
    for (const auto &i : dir->m_files) writeEntity(i);
    for (const auto &i : dir->m_subDirs) writeEntity(i);
}